

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::GRULayerParams::MergePartialFromCodedStream
          (GRULayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  short extraout_AX;
  short extraout_AX_00;
  short sVar5;
  uint uVar6;
  uint extraout_EAX;
  uint32 uVar7;
  ulong extraout_RAX;
  WeightParams *pWVar8;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  Type *this_00;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  uint8 *puVar9;
  ulong extraout_RAX_06;
  ulong extraout_RAX_07;
  pair<int,_int> pVar10;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  int byte_limit;
  int iVar14;
  pair<unsigned_long,_bool> pVar15;
  int local_a4;
  
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar7 = (uint32)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar12 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        if ((input->buffer_end_ <= pbVar1) || ((~(uint)*pbVar1 & uVar12) < 0x80)) goto LAB_00222c3d;
        uVar12 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar13 = (ulong)uVar12 | 0x100000000;
    }
    else {
LAB_00222c3d:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar13 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar13 = 0x100000000;
      }
      uVar13 = uVar7 | uVar13;
    }
    uVar12 = (uint)uVar13;
    if ((uVar13 & 0x100000000) == 0) goto LAB_00222724;
    uVar6 = (uint)(uVar13 >> 3) & 0x1fffffff;
    cVar11 = (char)uVar13;
    if (uVar6 < 0x32) {
      if (uVar6 < 0x14) {
        if (uVar6 < 10) {
          if (uVar6 == 1) {
            if (cVar11 == '\b') {
              puVar9 = input->buffer_;
              if ((input->buffer_end_ <= puVar9) || ((long)(char)*puVar9 < 0)) {
                pVar15 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
                this->inputvectorsize_ = pVar15.first;
                goto LAB_00222b8e;
              }
              this->inputvectorsize_ = (long)(char)*puVar9;
              goto LAB_00222a6f;
            }
          }
          else if ((uVar6 == 2) && (cVar11 == '\x10')) {
            puVar9 = input->buffer_;
            if ((input->buffer_end_ <= puVar9) || ((long)(char)*puVar9 < 0)) {
              pVar15 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
              this->outputvectorsize_ = pVar15.first;
LAB_00222b8e:
              if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
              goto LAB_00222c32;
              goto LAB_00222750;
            }
            this->outputvectorsize_ = (long)(char)*puVar9;
LAB_00222a6f:
            input->buffer_ = puVar9 + 1;
            goto LAB_00222750;
          }
          goto LAB_00222724;
        }
        if (uVar6 != 10) {
          if (uVar6 == 0xf) {
            MergePartialFromCodedStream();
            sVar5 = extraout_AX;
LAB_00222c08:
            if (sVar5 != 0) {
              iVar14 = 6;
              if (sVar5 != 1) goto LAB_00222750;
              goto LAB_00222753;
            }
          }
          goto LAB_00222724;
        }
        if (cVar11 != 'R') goto LAB_00222724;
        this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                            (&(this->activations_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar9 = input->buffer_;
        if ((puVar9 < input->buffer_end_) && (byte_limit = (int)(char)*puVar9, -1 < (char)*puVar9))
        {
          input->buffer_ = puVar9 + 1;
          bVar4 = true;
        }
        else {
          byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar4 = -1 < byte_limit;
        }
        iVar14 = 6;
        if ((((!bVar4) ||
             (pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                                 (input,byte_limit), (long)pVar10 < 0)) ||
            (bVar4 = ActivationParams::MergePartialFromCodedStream(this_00,input), !bVar4)) ||
           (bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                              (input,pVar10.first), !bVar4)) goto LAB_00222753;
LAB_00222750:
        iVar14 = 0;
      }
      else {
        if (uVar6 < 0x1f) {
          if (uVar6 == 0x1e) {
            if (cVar11 == -0xe) {
              if (this->updategateweightmatrix_ == (WeightParams *)0x0) {
                pWVar8 = (WeightParams *)operator_new(0x50);
                WeightParams::WeightParams(pWVar8);
                this->updategateweightmatrix_ = pWVar8;
              }
              MergePartialFromCodedStream();
              uVar13 = extraout_RAX_03;
              goto LAB_00222afc;
            }
          }
          else if (uVar6 == 0x14) {
            MergePartialFromCodedStream();
            sVar5 = extraout_AX_00;
            goto LAB_00222c08;
          }
          goto LAB_00222724;
        }
        if (uVar6 == 0x1f) {
          if (cVar11 == -6) {
            if (this->resetgateweightmatrix_ == (WeightParams *)0x0) {
              pWVar8 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(pWVar8);
              this->resetgateweightmatrix_ = pWVar8;
            }
            MergePartialFromCodedStream();
            uVar13 = extraout_RAX_06;
            goto LAB_00222afc;
          }
          goto LAB_00222724;
        }
        if ((uVar6 != 0x20) || (cVar11 != '\x02')) goto LAB_00222724;
        if (this->outputgateweightmatrix_ == (WeightParams *)0x0) {
          pWVar8 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(pWVar8);
          this->outputgateweightmatrix_ = pWVar8;
        }
        MergePartialFromCodedStream();
        uVar13 = extraout_RAX_00;
LAB_00222afc:
        iVar14 = local_a4;
        if ((uVar13 & 1) == 0) goto LAB_00222750;
      }
    }
    else {
      if (uVar6 < 0x46) {
        if (uVar6 == 0x32) {
          if (cVar11 == -0x6e) {
            if (this->updategaterecursionmatrix_ == (WeightParams *)0x0) {
              pWVar8 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(pWVar8);
              this->updategaterecursionmatrix_ = pWVar8;
            }
            MergePartialFromCodedStream();
            uVar13 = extraout_RAX_07;
            goto LAB_00222afc;
          }
        }
        else if (uVar6 == 0x33) {
          if (cVar11 == -0x66) {
            if (this->resetgaterecursionmatrix_ == (WeightParams *)0x0) {
              pWVar8 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(pWVar8);
              this->resetgaterecursionmatrix_ = pWVar8;
            }
            MergePartialFromCodedStream();
            uVar13 = extraout_RAX_04;
            goto LAB_00222afc;
          }
        }
        else if ((uVar6 == 0x34) && (cVar11 == -0x5e)) {
          if (this->outputgaterecursionmatrix_ == (WeightParams *)0x0) {
            pWVar8 = (WeightParams *)operator_new(0x50);
            WeightParams::WeightParams(pWVar8);
            this->outputgaterecursionmatrix_ = pWVar8;
          }
          MergePartialFromCodedStream();
          uVar13 = extraout_RAX_01;
          goto LAB_00222afc;
        }
LAB_00222724:
        iVar14 = 7;
        if ((uVar12 & 7) == 4 || uVar12 == 0) goto LAB_00222753;
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar12);
        if (bVar4) goto LAB_00222750;
      }
      else {
        if (uVar6 < 0x48) {
          if (uVar6 == 0x46) {
            if (cVar11 == '2') {
              if (this->updategatebiasvector_ == (WeightParams *)0x0) {
                pWVar8 = (WeightParams *)operator_new(0x50);
                WeightParams::WeightParams(pWVar8);
                this->updategatebiasvector_ = pWVar8;
              }
              MergePartialFromCodedStream();
              uVar13 = extraout_RAX_05;
              goto LAB_00222afc;
            }
          }
          else if ((uVar6 == 0x47) && (cVar11 == ':')) {
            if (this->resetgatebiasvector_ == (WeightParams *)0x0) {
              pWVar8 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(pWVar8);
              this->resetgatebiasvector_ = pWVar8;
            }
            MergePartialFromCodedStream();
            uVar13 = extraout_RAX;
            goto LAB_00222afc;
          }
          goto LAB_00222724;
        }
        if (uVar6 == 0x48) {
          if (cVar11 == 'B') {
            if (this->outputgatebiasvector_ == (WeightParams *)0x0) {
              pWVar8 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(pWVar8);
              this->outputgatebiasvector_ = pWVar8;
            }
            MergePartialFromCodedStream();
            uVar13 = extraout_RAX_02;
            goto LAB_00222afc;
          }
          goto LAB_00222724;
        }
        if (uVar6 != 100) goto LAB_00222724;
        MergePartialFromCodedStream();
        if ((short)extraout_EAX != 1) {
          if ((extraout_EAX & 0xffff) != 0) goto LAB_00222750;
          goto LAB_00222724;
        }
      }
LAB_00222c32:
      iVar14 = 6;
    }
LAB_00222753:
    if (iVar14 != 0) {
      return iVar14 != 6;
    }
  } while( true );
}

Assistant:

bool GRULayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.GRULayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 inputVectorSize = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &inputvectorsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 outputVectorSize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &outputvectorsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.ActivationParams activations = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_activations()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool sequenceOutput = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(120u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &sequenceoutput_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool hasBiasVectors = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(160u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &hasbiasvectors_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams updateGateWeightMatrix = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(242u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_updategateweightmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams resetGateWeightMatrix = 31;
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(250u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_resetgateweightmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams outputGateWeightMatrix = 32;
      case 32: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(258u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_outputgateweightmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams updateGateRecursionMatrix = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(402u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_updategaterecursionmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams resetGateRecursionMatrix = 51;
      case 51: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(410u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_resetgaterecursionmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams outputGateRecursionMatrix = 52;
      case 52: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(418u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_outputgaterecursionmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams updateGateBiasVector = 70;
      case 70: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(562u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_updategatebiasvector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams resetGateBiasVector = 71;
      case 71: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(570u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_resetgatebiasvector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams outputGateBiasVector = 72;
      case 72: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(578u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_outputgatebiasvector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool reverseInput = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(800u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &reverseinput_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.GRULayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.GRULayerParams)
  return false;
#undef DO_
}